

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

uint16_t udata_getHeaderSize_63(DataHeader *udh)

{
  ushort uVar1;
  uint16_t x;
  DataHeader *udh_local;
  
  if (udh == (DataHeader *)0x0) {
    udh_local._6_2_ = 0;
  }
  else if ((udh->info).isBigEndian == '\0') {
    udh_local._6_2_ = (udh->dataHeader).headerSize;
  }
  else {
    uVar1 = (udh->dataHeader).headerSize;
    udh_local._6_2_ = uVar1 << 8 | uVar1 >> 8;
  }
  return udh_local._6_2_;
}

Assistant:

U_CFUNC uint16_t
udata_getHeaderSize(const DataHeader *udh) {
    if(udh==NULL) {
        return 0;
    } else if(udh->info.isBigEndian==U_IS_BIG_ENDIAN) {
        /* same endianness */
        return udh->dataHeader.headerSize;
    } else {
        /* opposite endianness */
        uint16_t x=udh->dataHeader.headerSize;
        return (uint16_t)((x<<8)|(x>>8));
    }
}